

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O3

XSParticle * __thiscall
xercesc_4_0::XSObjectFactory::createElementParticle
          (XSObjectFactory *this,ContentSpecNode *rootNode,XSModel *xsModel)

{
  int iVar1;
  XSElementDeclaration *particleTerm;
  XSParticle *this_00;
  
  if ((SchemaElementDecl *)rootNode->fElementDecl == (SchemaElementDecl *)0x0) {
    this_00 = (XSParticle *)0x0;
  }
  else {
    this_00 = (XSParticle *)0x0;
    particleTerm = addOrFind(this,(SchemaElementDecl *)rootNode->fElementDecl,xsModel,
                             (XSComplexTypeDefinition *)0x0);
    if (particleTerm != (XSElementDeclaration *)0x0) {
      iVar1 = rootNode->fMaxOccurs;
      this_00 = (XSParticle *)XMemory::operator_new(0x50,this->fMemoryManager);
      XSParticle::XSParticle
                (this_00,TERM_ELEMENT,xsModel,&particleTerm->super_XSObject,
                 (long)rootNode->fMinOccurs,(long)iVar1,(long)iVar1 == 0xffffffffffffffff,
                 this->fMemoryManager);
    }
  }
  return this_00;
}

Assistant:

XSParticle*
XSObjectFactory::createElementParticle(const ContentSpecNode* const rootNode,
                                       XSModel* const xsModel)
{
    if (rootNode->getElementDecl())
    {
        XSElementDeclaration* xsElemDecl = addOrFind(
            (SchemaElementDecl*) rootNode->getElementDecl(), xsModel);

        if (xsElemDecl)
        {
            int m = rootNode->getMaxOccurs();
            XSParticle* particle = new (fMemoryManager) XSParticle
            (
                XSParticle::TERM_ELEMENT
                , xsModel
                , xsElemDecl
                , (XMLSize_t)rootNode->getMinOccurs()
                , (XMLSize_t)m
                , m == -1
                , fMemoryManager
            );

            return particle;
        }
    }

    return 0;
}